

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void Store16x4_SSE2(__m128i *p1,__m128i *p0,__m128i *q0,__m128i *q1,uint8_t *r0,uint8_t *r8,
                   int stride)

{
  __m128i *x;
  undefined8 uVar1;
  undefined8 uVar2;
  int stride_00;
  undefined1 auVar3 [12];
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  __m128i q1_s;
  __m128i q0_s;
  __m128i p0_s;
  __m128i p1_s;
  __m128i t1;
  uint8_t *dst;
  undefined1 uStack_104;
  undefined1 uStack_103;
  undefined1 uStack_f4;
  undefined1 uStack_f3;
  undefined1 uStack_e4;
  undefined1 uStack_e3;
  undefined1 uStack_d4;
  undefined1 uStack_d3;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  undefined1 uStack_2b;
  undefined1 uStack_2a;
  undefined1 uStack_29;
  undefined1 uStack_1b;
  undefined1 uStack_1a;
  undefined1 uStack_19;
  undefined1 uStack_b;
  undefined1 uStack_a;
  undefined1 uStack_9;
  
  uVar1 = in_RSI[1];
  uStack_d4 = (undefined1)((ulong)*in_RDI >> 0x20);
  uStack_d3 = (undefined1)((ulong)*in_RDI >> 0x28);
  uStack_e4 = (undefined1)((ulong)*in_RSI >> 0x20);
  uStack_e3 = (undefined1)((ulong)*in_RSI >> 0x28);
  uVar2 = in_RDI[1];
  uStack_b = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_a = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_9 = (undefined1)((ulong)uVar2 >> 0x38);
  uStack_1b = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_1a = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_19 = (undefined1)((ulong)uVar1 >> 0x38);
  uVar1 = in_RDX[1];
  uStack_f4 = (undefined1)((ulong)*in_RDX >> 0x20);
  uStack_f3 = (undefined1)((ulong)*in_RDX >> 0x28);
  uStack_104 = (undefined1)((ulong)*in_RCX >> 0x20);
  uStack_103 = (undefined1)((ulong)*in_RCX >> 0x28);
  uVar2 = in_RCX[1];
  uStack_2b = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_2a = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_29 = (undefined1)((ulong)uVar1 >> 0x38);
  uStack_3b = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_3a = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_39 = (undefined1)((ulong)uVar2 >> 0x38);
  x = (__m128i *)
      CONCAT17(uStack_103,
               CONCAT16(uStack_f3,
                        CONCAT15(uStack_e3,
                                 CONCAT14(uStack_d3,
                                          CONCAT13(uStack_104,
                                                   CONCAT12(uStack_f4,CONCAT11(uStack_e4,uStack_d4))
                                                  )))));
  stride_00 = CONCAT13(uStack_3b,CONCAT12(uStack_2b,CONCAT11(uStack_1b,uStack_b)));
  auVar3[4] = uStack_a;
  auVar3._0_4_ = stride_00;
  auVar3[5] = uStack_1a;
  auVar3[6] = uStack_2a;
  auVar3[7] = uStack_3a;
  auVar3[8] = uStack_9;
  auVar3[9] = uStack_19;
  auVar3[10] = uStack_29;
  auVar3[0xb] = uStack_39;
  dst = auVar3._4_8_;
  Store4x4_SSE2(x,dst,stride_00);
  Store4x4_SSE2(x,dst,stride_00);
  Store4x4_SSE2(x,dst,stride_00);
  Store4x4_SSE2(x,dst,stride_00);
  return;
}

Assistant:

static WEBP_INLINE void Store16x4_SSE2(const __m128i* const p1,
                                       const __m128i* const p0,
                                       const __m128i* const q0,
                                       const __m128i* const q1,
                                       uint8_t* r0, uint8_t* r8,
                                       int stride) {
  __m128i t1, p1_s, p0_s, q0_s, q1_s;

  // p0 = 71 70 61 60 51 50 41 40 31 30 21 20 11 10 01 00
  // p1 = f1 f0 e1 e0 d1 d0 c1 c0 b1 b0 a1 a0 91 90 81 80
  t1 = *p0;
  p0_s = _mm_unpacklo_epi8(*p1, t1);
  p1_s = _mm_unpackhi_epi8(*p1, t1);

  // q0 = 73 72 63 62 53 52 43 42 33 32 23 22 13 12 03 02
  // q1 = f3 f2 e3 e2 d3 d2 c3 c2 b3 b2 a3 a2 93 92 83 82
  t1 = *q0;
  q0_s = _mm_unpacklo_epi8(t1, *q1);
  q1_s = _mm_unpackhi_epi8(t1, *q1);

  // p0 = 33 32 31 30 23 22 21 20 13 12 11 10 03 02 01 00
  // q0 = 73 72 71 70 63 62 61 60 53 52 51 50 43 42 41 40
  t1 = p0_s;
  p0_s = _mm_unpacklo_epi16(t1, q0_s);
  q0_s = _mm_unpackhi_epi16(t1, q0_s);

  // p1 = b3 b2 b1 b0 a3 a2 a1 a0 93 92 91 90 83 82 81 80
  // q1 = f3 f2 f1 f0 e3 e2 e1 e0 d3 d2 d1 d0 c3 c2 c1 c0
  t1 = p1_s;
  p1_s = _mm_unpacklo_epi16(t1, q1_s);
  q1_s = _mm_unpackhi_epi16(t1, q1_s);

  Store4x4_SSE2(&p0_s, r0, stride);
  r0 += 4 * stride;
  Store4x4_SSE2(&q0_s, r0, stride);

  Store4x4_SSE2(&p1_s, r8, stride);
  r8 += 4 * stride;
  Store4x4_SSE2(&q1_s, r8, stride);
}